

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O2

vector<unsigned_long,_true> *
duckdb::SubgraphsConnectedByEdge
          (vector<unsigned_long,_true> *__return_storage_ptr__,FilterInfoWithTotalDomains *edge,
          vector<duckdb::Subgraph2Denominator,_true> *subgraphs)

{
  bool bVar1;
  reference pvVar2;
  pointer pSVar3;
  pointer pSVar4;
  size_type __n;
  size_type local_38;
  size_type local_30;
  
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pSVar4 = (subgraphs->
           super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
           ).
           super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (subgraphs->
           super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
           ).
           super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar4 != pSVar3) {
    __n = 0;
    while (local_38 = __n, __n != ((long)pSVar3 - (long)pSVar4) / 0x18) {
      while (__n = __n + 1, local_30 = __n, __n != ((long)pSVar3 - (long)pSVar4) / 0x18) {
        pvVar2 = ::std::
                 vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ::at(&subgraphs->
                       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      ,local_38);
        bVar1 = EdgeConnects(edge,pvVar2);
        if (bVar1) {
          pvVar2 = ::std::
                   vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ::at(&subgraphs->
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ,__n);
          bVar1 = EdgeConnects(edge,pvVar2);
          if (bVar1) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       __return_storage_ptr__,&local_38);
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       __return_storage_ptr__,&local_30);
            return __return_storage_ptr__;
          }
        }
        pSVar4 = (subgraphs->
                 super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ).
                 super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar3 = (subgraphs->
                 super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ).
                 super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pvVar2 = ::std::
               vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>::
               at(&subgraphs->
                   super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                  ,local_38);
      bVar1 = EdgeConnects(edge,pvVar2);
      if (bVar1) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__,
                   &local_38);
        return __return_storage_ptr__;
      }
      pSVar4 = (subgraphs->
               super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ).
               super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (subgraphs->
               super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ).
               super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __n = local_38 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<idx_t> SubgraphsConnectedByEdge(FilterInfoWithTotalDomains &edge, vector<Subgraph2Denominator> &subgraphs) {
	vector<idx_t> res;
	if (subgraphs.empty()) {
		return res;
	} else {
		// check the combinations of subgraphs and see if the edge connects two of them,
		// if so, return the indexes of the two subgraphs within the vector
		for (idx_t outer = 0; outer != subgraphs.size(); outer++) {
			// check if the edge connects two subgraphs.
			for (idx_t inner = outer + 1; inner != subgraphs.size(); inner++) {
				if (EdgeConnects(edge, subgraphs.at(outer)) && EdgeConnects(edge, subgraphs.at(inner))) {
					// order is important because we will delete the inner subgraph later
					res.push_back(outer);
					res.push_back(inner);
					return res;
				}
			}
			// if the edge does not connect two subgraphs, see if the edge connects with just outer
			// merge subgraph.at(outer) with the RelationSet(s) that edge connects
			if (EdgeConnects(edge, subgraphs.at(outer))) {
				res.push_back(outer);
				return res;
			}
		}
	}
	// this edge connects only the relations it connects. Return an empty result so a new subgraph is created.
	return res;
}